

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

int arkInterpInit_Lagrange(void *arkode_mem,ARKInterp I,realtype tnew)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  uint nvec;
  long lVar5;
  long lVar6;
  uint *puVar7;
  
  if (arkode_mem == (void *)0x0) {
    return -0x15;
  }
  puVar7 = (uint *)I->content;
  if ((int)puVar7[1] < (int)*puVar7) {
    if (*(void **)(puVar7 + 4) != (void *)0x0) {
      free(*(void **)(puVar7 + 4));
      puVar7 = (uint *)I->content;
      puVar7[4] = 0;
      puVar7[5] = 0;
    }
    pvVar4 = *(void **)(puVar7 + 2);
    if (pvVar4 != (void *)0x0) {
      uVar1 = *puVar7;
      if (0 < (int)uVar1) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          if (*(long *)(*(long *)(puVar7 + 2) + lVar5) != 0) {
            arkFreeVec((ARKodeMem)arkode_mem,(N_Vector *)(*(long *)(puVar7 + 2) + lVar5));
            *(undefined8 *)(*(long *)((long)I->content + 8) + lVar5) = 0;
            puVar7 = (uint *)I->content;
            uVar1 = *puVar7;
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 8;
        } while (lVar6 < (int)uVar1);
        pvVar4 = *(void **)(puVar7 + 2);
      }
      free(pvVar4);
      puVar7 = (uint *)I->content;
      puVar7[2] = 0;
      puVar7[3] = 0;
    }
  }
  if (*(long *)(puVar7 + 4) == 0) {
    pvVar4 = malloc((long)(int)*puVar7 << 3);
    *(void **)(puVar7 + 4) = pvVar4;
    if (pvVar4 != (void *)0x0) goto LAB_003deec7;
LAB_003defba:
    (*I->ops->free)(arkode_mem,I);
    iVar3 = -0x14;
  }
  else {
LAB_003deec7:
    uVar1 = *puVar7;
    if (*(long *)(puVar7 + 2) == 0) {
      pvVar4 = malloc((long)(int)uVar1 << 3);
      *(void **)(puVar7 + 2) = pvVar4;
      if (pvVar4 == (void *)0x0) goto LAB_003defba;
      if (0 < (int)uVar1) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          *(undefined8 *)(*(long *)(puVar7 + 2) + lVar6) = 0;
          iVar2 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x110),
                              (N_Vector *)(*(long *)((long)I->content + 8) + lVar6));
          if (iVar2 == 0) goto LAB_003defba;
          lVar5 = lVar5 + 1;
          puVar7 = (uint *)I->content;
          uVar1 = *puVar7;
          lVar6 = lVar6 + 8;
        } while (lVar5 < (int)uVar1);
      }
    }
    nvec = puVar7[1];
    if ((int)puVar7[1] < (int)uVar1) {
      puVar7[1] = uVar1;
      nvec = uVar1;
    }
    if (0 < (int)nvec) {
      memset(*(void **)(puVar7 + 4),0,(ulong)nvec << 3);
    }
    iVar2 = N_VConstVectorArray(nvec,0.0,*(N_Vector **)(puVar7 + 2));
    iVar3 = -0x1c;
    if (iVar2 == 0) {
      pvVar4 = I->content;
      **(realtype **)((long)pvVar4 + 0x10) = tnew;
      N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),
               (N_Vector)**(undefined8 **)((long)pvVar4 + 8));
      *(undefined4 *)((long)I->content + 0x18) = 1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int arkInterpInit_Lagrange(void* arkode_mem, ARKInterp I,
                           realtype tnew)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* check if storage has increased since the last init */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I)) {
    if (LINT_THIST(I) != NULL) {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }
    if (LINT_YHIST(I) != NULL) {
      for (i=0; i<LINT_NMAX(I); i++) {
        if (LINT_YJ(I,i) != NULL) {
          arkFreeVec(ark_mem, &(LINT_YJ(I,i)));
          LINT_YJ(I,i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
  }

  /* allocate storage for time and solution histories */
  if (LINT_THIST(I) == NULL) {
    LINT_THIST(I) = (realtype*) malloc(LINT_NMAX(I) * sizeof(realtype));
    if (LINT_THIST(I) == NULL) {
      arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
    }
  }

  /* solution history allocation */
  if (LINT_YHIST(I) == NULL) {
    LINT_YHIST(I) = (N_Vector*) malloc(LINT_NMAX(I) * sizeof(N_Vector));
    if (LINT_YHIST(I) == NULL) {
      arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
    }
    for (i=0; i<LINT_NMAX(I); i++) {
      LINT_YJ(I,i) = NULL;
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(LINT_YJ(I,i)))) {
        arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
      }
    }
  }

  /* update allocated size if necesary */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I))
    LINT_NMAXALLOC(I) = LINT_NMAX(I);

  /* zero out history (to be safe) */
  for (i=0; i<LINT_NMAXALLOC(I); i++)
    LINT_TJ(I,i) = RCONST(0.0);
  if (N_VConstVectorArray(LINT_NMAXALLOC(I), RCONST(0.0), LINT_YHIST(I)))
    return(ARK_VECTOROP_ERR);

  /* set current time and state as first entries of (t,y) history, update counter */
  LINT_TJ(I,0) = tnew;
  N_VScale(ONE, ark_mem->yn, LINT_YJ(I,0));
  LINT_NHIST(I) = 1;

  /* return with success */
  return(ARK_SUCCESS);
}